

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_class_panel(void)

{
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  Fl_Group *pFVar3;
  Fl_Text_Editor *pFVar4;
  Fl_Text_Buffer *this;
  Fl_Window *this_00;
  Fl_Button *this_01;
  Fl_Box *o_3;
  Fl_Group *o_2;
  Fl_Box *o_1;
  Fl_Group *o;
  
  pFVar1 = (Fl_Widget *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar1,0x156,0xc4,"Class Properties");
  class_panel = (Fl_Double_Window *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,10,0x118,0x14,(char *)0x0);
  (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[6])();
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar1,10,10,0x3c,0x14,"public");
  c_public_button = (Fl_Light_Button *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Make the class publicly accessible.");
  Fl_Widget::labelsize((Fl_Widget *)c_public_button,0xb);
  Fl_Widget::when((Fl_Widget *)c_public_button,'\0');
  (*(c_public_button->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,0x50,10,0xd2,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar1);
  Fl_Group::end(pFVar2);
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,10,0x14,0x140,0x14,"Name:");
  c_name_input = (Fl_Input *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Name of class.");
  Fl_Widget::labelfont((Fl_Widget *)c_name_input,1);
  Fl_Widget::labelsize((Fl_Widget *)c_name_input,0xb);
  Fl_Input_::textfont(&c_name_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&c_name_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)c_name_input,5);
  Fl_Widget::when((Fl_Widget *)c_name_input,'\0');
  pFVar1 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar1,10,0x37,0x140,0x14,"Subclass of (text between : and {)");
  c_subclass_input = (Fl_Input *)pFVar1;
  Fl_Widget::tooltip(pFVar1,"Name of subclass.");
  Fl_Widget::labelfont((Fl_Widget *)c_subclass_input,1);
  Fl_Widget::labelsize((Fl_Widget *)c_subclass_input,0xb);
  Fl_Input_::textfont(&c_subclass_input->super_Fl_Input_,4);
  Fl_Input_::textsize(&c_subclass_input->super_Fl_Input_,0xb);
  Fl_Widget::align((Fl_Widget *)c_subclass_input,5);
  Fl_Widget::when((Fl_Widget *)c_subclass_input,'\0');
  pFVar4 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar4,10,0x5a,0x140,0x41,"Comment:");
  c_comment_input = pFVar4;
  Fl_Widget::tooltip((Fl_Widget *)pFVar4,"Class comment in Doxygen format");
  Fl_Widget::box((Fl_Widget *)c_comment_input,FL_DOWN_BOX);
  Fl_Widget::labelfont((Fl_Widget *)c_comment_input,1);
  Fl_Widget::labelsize((Fl_Widget *)c_comment_input,0xb);
  Fl_Text_Display::textfont(&c_comment_input->super_Fl_Text_Display,4);
  Fl_Text_Display::textsize(&c_comment_input->super_Fl_Text_Display,0xb);
  Fl_Widget::align((Fl_Widget *)c_comment_input,5);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)c_comment_input);
  pFVar4 = c_comment_input;
  this = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this,0,0x400);
  Fl_Text_Display::buffer(&pFVar4->super_Fl_Text_Display,this);
  Fl_Text_Editor::add_key_binding(c_comment_input,0xff09,0,use_tab_navigation);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0xa5,0x140,0x14,(char *)0x0);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,200,0xa5,0x3c,0x14,"OK");
  c_panel_ok = (Fl_Return_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  this_00 = Fl_Widget::window((Fl_Widget *)c_panel_ok);
  Fl_Window::hotspot(this_00,(Fl_Widget *)c_panel_ok,0);
  this_01 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_01,0x10e,0xa5,0x3c,0x14,"Cancel");
  c_panel_cancel = this_01;
  Fl_Button::shortcut(this_01,0xff1b);
  Fl_Widget::labelsize(&c_panel_cancel->super_Fl_Widget,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,0xa5,0xb9,0x14,(char *)0x0);
  pFVar3 = Fl_Group::current();
  Fl_Group::resizable(pFVar3,pFVar1);
  Fl_Group::end(pFVar2);
  Fl_Window::set_modal(&class_panel->super_Fl_Window);
  Fl_Window::size_range(&class_panel->super_Fl_Window,0x157,0xbc,0,0,0,0,0);
  Fl_Group::end((Fl_Group *)class_panel);
  return class_panel;
}

Assistant:

Fl_Double_Window* make_class_panel() {
  { class_panel = new Fl_Double_Window(342, 196, "Class Properties");
    class_panel->labelsize(11);
    { Fl_Group* o = new Fl_Group(10, 10, 280, 20);
      o->hide();
      { c_public_button = new Fl_Light_Button(10, 10, 60, 20, "public");
        c_public_button->tooltip("Make the class publicly accessible.");
        c_public_button->labelsize(11);
        c_public_button->when(FL_WHEN_NEVER);
        c_public_button->hide();
      } // Fl_Light_Button* c_public_button
      { Fl_Box* o = new Fl_Box(80, 10, 210, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { c_name_input = new Fl_Input(10, 20, 320, 20, "Name:");
      c_name_input->tooltip("Name of class.");
      c_name_input->labelfont(1);
      c_name_input->labelsize(11);
      c_name_input->textfont(4);
      c_name_input->textsize(11);
      c_name_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      c_name_input->when(FL_WHEN_NEVER);
    } // Fl_Input* c_name_input
    { c_subclass_input = new Fl_Input(10, 55, 320, 20, "Subclass of (text between : and {)");
      c_subclass_input->tooltip("Name of subclass.");
      c_subclass_input->labelfont(1);
      c_subclass_input->labelsize(11);
      c_subclass_input->textfont(4);
      c_subclass_input->textsize(11);
      c_subclass_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      c_subclass_input->when(FL_WHEN_NEVER);
    } // Fl_Input* c_subclass_input
    { c_comment_input = new Fl_Text_Editor(10, 90, 320, 65, "Comment:");
      c_comment_input->tooltip("Class comment in Doxygen format");
      c_comment_input->box(FL_DOWN_BOX);
      c_comment_input->labelfont(1);
      c_comment_input->labelsize(11);
      c_comment_input->textfont(4);
      c_comment_input->textsize(11);
      c_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(c_comment_input);
      c_comment_input->buffer(new Fl_Text_Buffer());
      c_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* c_comment_input
    { Fl_Group* o = new Fl_Group(10, 165, 320, 20);
      { c_panel_ok = new Fl_Return_Button(200, 165, 60, 20, "OK");
        c_panel_ok->labelsize(11);
        c_panel_ok->window()->hotspot(c_panel_ok);
      } // Fl_Return_Button* c_panel_ok
      { c_panel_cancel = new Fl_Button(270, 165, 60, 20, "Cancel");
        c_panel_cancel->shortcut(0xff1b);
        c_panel_cancel->labelsize(11);
      } // Fl_Button* c_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 165, 185, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    class_panel->set_modal();
    class_panel->size_range(343, 188);
    class_panel->end();
  } // Fl_Double_Window* class_panel
  return class_panel;
}